

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

double __thiscall icu_63::CalendarAstronomer::getMoonAge(CalendarAstronomer *this)

{
  double dVar1;
  CalendarAstronomer *this_local;
  
  getMoonPosition(this);
  dVar1 = norm2PI(this->moonEclipLong - this->sunLongitude);
  return dVar1;
}

Assistant:

double CalendarAstronomer::getMoonAge() {
    // See page 147 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.
    //
    // Force the moon's position to be calculated.  We're going to use
    // some the intermediate results cached during that calculation.
    //
    getMoonPosition();

    return norm2PI(moonEclipLong - sunLongitude);
}